

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar5 = extraout_RDX;
  do {
    bVar1 = *(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                      _vptr_TestEventListener;
    uVar2 = (ulong)bVar1;
    if (uVar2 < 0x3e) {
      if ((0x2000006000000400U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) {
          return __return_storage_ptr__;
        }
        goto LAB_001a2fc9;
      }
      String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)bVar1,(uchar)uVar5);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1c7476);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      uVar5 = extraout_RDX_00;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
        uVar5 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar5 = extraout_RDX_02;
      }
    }
    else {
LAB_001a2fc9:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar5 = extraout_RDX_03;
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}